

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O0

void __thiscall Excel::RecordSubstream::seek(RecordSubstream *this,int32_t pos,SeekType type)

{
  _Ios_Seekdir in_ESI;
  long in_RDI;
  seekdir dir;
  
  std::istream::seekg(in_RDI + 0x10,in_ESI);
  return;
}

Assistant:

inline void
RecordSubstream::seek( int32_t pos, SeekType type )
{
	std::ios::seekdir dir;

	if( type == Stream::FromBeginning )
		dir = std::ios::beg;
	else if( type == Stream::FromCurrent )
		dir = std::ios::cur;
	else
		dir = std::ios::end;

	m_stream.seekg( pos, dir );
}